

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

ethash_h256_t * stringToBlockhash(ethash_h256_t *__return_storage_ptr__,string *_s)

{
  bytes b;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  hexStringToBytes((bytes *)&local_28,_s);
  memcpy(__return_storage_ptr__,local_28._M_impl.super__Vector_impl_data._M_start,
         (long)local_28._M_impl.super__Vector_impl_data._M_finish -
         (long)local_28._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

ethash_h256_t stringToBlockhash(std::string const& _s)
{
	ethash_h256_t ret;
	bytes b = hexStringToBytes(_s);
	memcpy(&ret, b.data(), b.size());
	return ret;
}